

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

int64_t hdr_value_at_index(hdr_histogram *h,int32_t index)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  
  iVar2 = h->sub_bucket_half_count;
  uVar1 = iVar2 - 1;
  iVar4 = index >> ((byte)h->sub_bucket_half_count_magnitude & 0x1f);
  cVar3 = (char)iVar4 + -1;
  if (iVar4 < 1) {
    cVar3 = '\0';
    iVar2 = 0;
  }
  return (long)(int)(iVar2 + (uVar1 & index)) << (cVar3 + (char)h->unit_magnitude & 0x3fU);
}

Assistant:

int64_t hdr_value_at_index(const struct hdr_histogram *h, int32_t index)
{
    int32_t bucket_index = (index >> h->sub_bucket_half_count_magnitude) - 1;
    int32_t sub_bucket_index = (index & (h->sub_bucket_half_count - 1)) + h->sub_bucket_half_count;

    if (bucket_index < 0)
    {
        sub_bucket_index -= h->sub_bucket_half_count;
        bucket_index = 0;
    }

    return value_from_index(bucket_index, sub_bucket_index, h->unit_magnitude);
}